

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5VocabInstanceNext(Fts5VocabCursor *pCsr)

{
  int iVar1;
  Fts5VocabCursor *pCsr_00;
  i64 *piOff;
  long in_RDI;
  bool bVar2;
  int *po;
  i64 *pp;
  Fts5IndexIter *pIter;
  int rc;
  int eDetail;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  
  iVar5 = *(int *)(*(long *)(*(long *)(in_RDI + 0x10) + 0x18) + 0x74);
  iVar4 = 0;
  uVar3 = *(undefined8 *)(in_RDI + 0x20);
  pCsr_00 = (Fts5VocabCursor *)(in_RDI + 0x70);
  piOff = (i64 *)(in_RDI + 0x78);
  do {
    bVar2 = true;
    if (iVar5 != 1) {
      iVar1 = sqlite3Fts5PoslistNext64
                        ((u8 *)CONCAT44(iVar5,iVar4),(int)((ulong)uVar3 >> 0x20),(int *)pCsr_00,
                         piOff);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) {
      return iVar4;
    }
    *(undefined8 *)(in_RDI + 0x70) = 0;
    *(undefined4 *)(in_RDI + 0x78) = 0;
    iVar4 = sqlite3Fts5IterNextScan((Fts5IndexIter *)pCsr_00);
    if (iVar4 == 0) {
      iVar4 = fts5VocabInstanceNewTerm(pCsr_00);
      if (*(int *)(in_RDI + 0x18) != 0) {
        return iVar4;
      }
      if (iVar5 == 1) {
        return iVar4;
      }
    }
    if (iVar4 != 0) {
      *(undefined4 *)(in_RDI + 0x18) = 1;
      return iVar4;
    }
  } while( true );
}

Assistant:

static int fts5VocabInstanceNext(Fts5VocabCursor *pCsr){
  int eDetail = pCsr->pFts5->pConfig->eDetail;
  int rc = SQLITE_OK;
  Fts5IndexIter *pIter = pCsr->pIter;
  i64 *pp = &pCsr->iInstPos;
  int *po = &pCsr->iInstOff;

  assert( sqlite3Fts5IterEof(pIter)==0 );
  assert( pCsr->bEof==0 );
  while( eDetail==FTS5_DETAIL_NONE
      || sqlite3Fts5PoslistNext64(pIter->pData, pIter->nData, po, pp)
  ){
    pCsr->iInstPos = 0;
    pCsr->iInstOff = 0;

    rc = sqlite3Fts5IterNextScan(pCsr->pIter);
    if( rc==SQLITE_OK ){
      rc = fts5VocabInstanceNewTerm(pCsr);
      if( pCsr->bEof || eDetail==FTS5_DETAIL_NONE ) break;
    }
    if( rc ){
      pCsr->bEof = 1;
      break;
    }
  }

  return rc;
}